

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_step,
                       void *p_step_fast,char *format,ImGuiInputTextFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiDataTypeInfo *pIVar5;
  char *text_end;
  float fVar6;
  void *local_108;
  void *local_e8;
  char *label_end;
  ImVec2 local_b4;
  ImGuiButtonFlags local_ac;
  undefined8 uStack_a8;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_frame_padding;
  float button_size;
  bool value_changed;
  char buf [64];
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  void *p_step_fast_local;
  void *p_step_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    buf._56_8_ = &GImGui->Style;
    window = (ImGuiWindow *)format;
    if (format == (char *)0x0) {
      pIVar5 = DataTypeGetInfo(data_type);
      window = (ImGuiWindow *)pIVar5->PrintFmt;
    }
    DataTypeFormatString((char *)&button_size,0x40,data_type,p_data,(char *)window);
    backup_frame_padding.y._3_1_ = 0;
    if ((flags & 0x20002U) == 0) {
      flags = flags | 1;
    }
    if (p_step == (void *)0x0) {
      bVar2 = InputText(label,(char *)&button_size,0x40,flags | 0x8000010U,
                        (ImGuiInputTextCallback)0x0,(void *)0x0);
      if (bVar2) {
        backup_frame_padding.y._3_1_ =
             DataTypeApplyFromText((char *)&button_size,data_type,p_data,(char *)window);
      }
    }
    else {
      backup_frame_padding.x = GetFrameHeight();
      BeginGroup();
      PushID(label);
      fVar6 = CalcItemWidth();
      fVar3 = -(backup_frame_padding.x + *(float *)(buf._56_8_ + 0x54));
      fVar3 = ImMax<float>(1.0,fVar3 + fVar3 + fVar6);
      SetNextItemWidth(fVar3);
      bVar2 = InputText("",(char *)&button_size,0x40,flags | 0x8000010U,(ImGuiInputTextCallback)0x0,
                        (void *)0x0);
      if (bVar2) {
        backup_frame_padding.y._3_1_ =
             DataTypeApplyFromText((char *)&button_size,data_type,p_data,(char *)window);
      }
      uStack_a8 = *(undefined8 *)(buf._56_8_ + 0x3c);
      *(undefined4 *)(buf._56_8_ + 0x3c) = *(undefined4 *)(buf._56_8_ + 0x40);
      local_ac = 0x2400;
      if ((flags & 0x4000U) != 0) {
        BeginDisabled(true);
      }
      SameLine(0.0,*(float *)(buf._56_8_ + 0x54));
      ImVec2::ImVec2(&local_b4,backup_frame_padding.x,backup_frame_padding.x);
      bVar2 = ButtonEx("-",&local_b4,local_ac);
      if (bVar2) {
        local_e8 = p_step;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (p_step_fast != (void *)0x0)) {
          local_e8 = p_step_fast;
        }
        DataTypeApplyOp(data_type,0x2d,p_data,p_data,local_e8);
        backup_frame_padding.y._3_1_ = 1;
      }
      SameLine(0.0,*(float *)(buf._56_8_ + 0x54));
      ImVec2::ImVec2((ImVec2 *)((long)&label_end + 4),backup_frame_padding.x,backup_frame_padding.x)
      ;
      bVar2 = ButtonEx("+",(ImVec2 *)((long)&label_end + 4),local_ac);
      if (bVar2) {
        local_108 = p_step;
        if ((((pIVar1->IO).KeyCtrl & 1U) != 0) && (p_step_fast != (void *)0x0)) {
          local_108 = p_step_fast;
        }
        DataTypeApplyOp(data_type,0x2b,p_data,p_data,local_108);
        backup_frame_padding.y._3_1_ = 1;
      }
      if ((flags & 0x4000U) != 0) {
        EndDisabled();
      }
      text_end = FindRenderedTextEnd(label,(char *)0x0);
      if (label != text_end) {
        SameLine(0.0,*(float *)(buf._56_8_ + 0x54));
        TextEx(label,text_end,0);
      }
      *(undefined8 *)(buf._56_8_ + 0x3c) = uStack_a8;
      PopID();
      EndGroup();
    }
    if ((backup_frame_padding.y._3_1_ & 1) != 0) {
      MarkItemEdited((pIVar1->LastItemData).ID);
    }
    label_local._7_1_ = (bool)(backup_frame_padding.y._3_1_ & 1);
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_step, const void* p_step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;

    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, p_data, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;
    flags |= ImGuiInputTextFlags_NoMarkEdited;  // We call MarkItemEdited() ourselves by comparing the actual data rather than the string.

    if (p_step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        SetNextItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);

        // Step buttons
        const ImVec2 backup_frame_padding = style.FramePadding;
        style.FramePadding.x = style.FramePadding.y;
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            BeginDisabled();
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', p_data, p_data, g.IO.KeyCtrl && p_step_fast ? p_step_fast : p_step);
            value_changed = true;
        }
        if (flags & ImGuiInputTextFlags_ReadOnly)
            EndDisabled();

        const char* label_end = FindRenderedTextEnd(label);
        if (label != label_end)
        {
            SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_end);
        }
        style.FramePadding = backup_frame_padding;

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyFromText(buf, data_type, p_data, format);
    }
    if (value_changed)
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}